

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_compare.cpp
# Opt level: O1

void __thiscall
ktx::CommandCompare::compareImagesRaw(CommandCompare *this,PrintDiff *diff,InputStreams *streams)

{
  ktx_uint32_t kVar1;
  pointer pKVar2;
  size_t __nbytes;
  _Alloc_hider _Var3;
  size_type sVar4;
  ulong __n;
  byte bVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  pointer __s;
  void *pvVar9;
  uint uVar10;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  pointer pcVar11;
  InputStreams *pIVar12;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  format_args args;
  format_args args_00;
  format_args args_01;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> buffers [2];
  ktxLevelIndexEntry entry;
  uint32_t numLevels [2];
  optional<ktxLevelIndexEntry> levelIndexEntry [2];
  string local_148;
  string local_120;
  CommandCompare *local_100;
  undefined1 local_f4 [4];
  uint local_f0;
  uint local_ec;
  string local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  ulong local_a0;
  char local_90;
  PrintDiff *local_80;
  InputStreams *local_78;
  pointer local_70;
  pointer local_68;
  pointer pcStack_60;
  undefined8 local_58;
  char *pcStack_50;
  pointer local_48 [3];
  
  local_100 = this;
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"Image Data\n\n","");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(&diff->context,
                    (diff->context).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&diff->context,
             &local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  pKVar2 = (local_100->headers).super__Vector_base<KTX_header2,_std::allocator<KTX_header2>_>.
           _M_impl.super__Vector_impl_data._M_start;
  kVar1 = pKVar2->levelCount;
  local_f0 = kVar1 + (kVar1 == 0);
  uVar10 = pKVar2[1].levelCount;
  local_ec = uVar10 + (uVar10 == 0);
  uVar6 = local_ec;
  if (uVar10 <= local_f0) {
    uVar6 = local_f0;
  }
  if (uVar6 != 0) {
    local_70 = (pointer)(ulong)uVar6;
    pcVar11 = (pointer)0x0;
    local_78 = streams;
    local_80 = diff;
    do {
      lVar8 = 0x18;
      do {
        *(undefined1 *)((long)&local_c8._M_dataplus._M_p + lVar8) = 0;
        lVar8 = lVar8 + 0x20;
      } while (lVar8 != 0x58);
      lVar8 = 3;
      pIVar12 = streams;
      do {
        if (pcVar11 < (pointer)(ulong)*(uint *)(local_f4 + lVar8 + 1)) {
          local_58 = 0xf;
          pcStack_50 = "the level index";
          read(local_100,(int)pIVar12,(void *)((long)pcVar11 * 0x18 + 0x50),(size_t)&local_120);
          (&local_e8._M_string_length)[lVar8] = (size_type)local_120._M_dataplus._M_p;
          *(size_type *)((long)&local_e8.field_2 + lVar8 * 8) = local_120._M_string_length;
          *(size_type *)((long)&local_e8.field_2 + lVar8 * 8 + 8) =
               local_120.field_2._M_allocated_capacity;
          if (*(char *)&(&local_c8._M_dataplus)[lVar8]._M_p == '\0') {
            *(undefined1 *)&(&local_c8._M_dataplus)[lVar8]._M_p = 1;
          }
        }
        sVar4 = local_c8._M_string_length;
        lVar8 = lVar8 + 4;
        pIVar12 = (InputStreams *)&pIVar12->field_0x3b8;
      } while (lVar8 == 7);
      if ((local_c8.field_2._M_local_buf[8] == '\0') || (local_90 == '\0')) {
        bVar5 = 1;
      }
      else {
        bVar5 = 0;
      }
      uVar10 = 1;
      if (local_c8._M_string_length == local_a0) {
        uVar10 = (uint)bVar5;
      }
      if (bVar5 != 0) {
        uVar10 = (uint)bVar5;
      }
      if ((char)uVar10 == '\0') {
        local_f4 = (undefined1  [4])uVar10;
        __s = (pointer)operator_new__(local_c8._M_string_length);
        memset(__s,0,sVar4);
        __n = local_a0;
        local_148._M_dataplus._M_p = __s;
        pvVar9 = operator_new__(local_a0);
        memset(pvVar9,0,__n);
        local_148._M_string_length = (size_type)pvVar9;
        lVar8 = 0;
        do {
          pvVar9 = *(void **)((long)&local_c8._M_dataplus._M_p + lVar8 * 4);
          __nbytes = *(size_t *)((long)&local_148._M_dataplus._M_p + lVar8);
          fmt.size_ = 2;
          fmt.data_ = (char *)0xd;
          args.field_1.args_ = in_R9.args_;
          args.desc_ = (unsigned_long_long)&local_e8;
          local_e8._M_dataplus._M_p = pcVar11;
          ::fmt::v10::vformat_abi_cxx11_(&local_120,(v10 *)0x1fee60,fmt,args);
          local_68 = (pointer)local_120._M_string_length;
          pcStack_60 = local_120._M_dataplus._M_p;
          read(local_100,(int)streams,pvVar9,__nbytes);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_120._M_dataplus._M_p != &local_120.field_2) {
            operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
          }
          lVar8 = lVar8 + 8;
          streams = (InputStreams *)&streams->field_0x3b8;
        } while (lVar8 == 8);
        iVar7 = bcmp(local_148._M_dataplus._M_p,(void *)local_148._M_string_length,
                     local_c8._M_string_length);
        streams = local_78;
        diff = local_80;
        lVar8 = 8;
        do {
          pvVar9 = *(void **)((long)&local_148._M_dataplus._M_p + lVar8);
          if (pvVar9 != (void *)0x0) {
            operator_delete__(pvVar9);
          }
          *(undefined8 *)((long)&local_148._M_dataplus._M_p + lVar8) = 0;
          lVar8 = lVar8 + -8;
        } while (lVar8 != -8);
        uVar10 = (uint)local_f4 & 0xff;
        if (iVar7 != 0) {
          uVar10 = 1;
        }
      }
      if ((char)uVar10 != '\0') {
        fmt_00.size_ = 2;
        fmt_00.data_ = (char *)0x19;
        args_00.field_1.values_ = in_R9.values_;
        args_00.desc_ = (unsigned_long_long)&local_148;
        local_148._M_dataplus._M_p = pcVar11;
        ::fmt::v10::vformat_abi_cxx11_(&local_e8,(v10 *)"Mismatch in level {} data",fmt_00,args_00);
        sVar4 = local_e8._M_string_length;
        _Var3._M_p = local_e8._M_dataplus._M_p;
        fmt_01.size_ = 2;
        fmt_01.data_ = (char *)0x4;
        args_01.field_1.values_ = in_R9.values_;
        args_01.desc_ = (unsigned_long_long)local_48;
        local_48[0] = pcVar11;
        ::fmt::v10::vformat_abi_cxx11_(&local_148,(v10 *)"m={}",fmt_01,args_01);
        local_120._M_dataplus._M_p = (pointer)sVar4;
        local_120._M_string_length = (size_type)_Var3._M_p;
        local_120.field_2._M_allocated_capacity = local_148._M_string_length;
        local_120.field_2._8_8_ = local_148._M_dataplus._M_p;
        PrintDiff::operator<<(diff,(DiffMismatch *)&local_120);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._M_dataplus._M_p != &local_148.field_2) {
          operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
          operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
        }
      }
      pcVar11 = pcVar11 + 1;
    } while (pcVar11 != local_70);
  }
  return;
}

Assistant:

void CommandCompare::compareImagesRaw(PrintDiff& diff, InputStreams& streams) {
    diff.setContext("Image Data\n\n");

    const uint32_t numLevels[] = {
        std::max(1u, headers[0].levelCount),
        std::max(1u, headers[1].levelCount)
    };
    const uint32_t maxNumLevels = std::max(numLevels[0], numLevels[1]);

    for (uint32_t level = 0; level < maxNumLevels; ++level) {
        const auto levelIndexEntryOffset = sizeof(KTX_header2) + level * sizeof(ktxLevelIndexEntry);
        std::optional<ktxLevelIndexEntry> levelIndexEntry[2];
        for (std::size_t i = 0; i < streams.size(); ++i)
            if (level < numLevels[i]) {
                ktxLevelIndexEntry entry;
                read(streams[i], levelIndexEntryOffset, &entry, sizeof(entry), "the level index");
                levelIndexEntry[i] = entry;
            }

        bool mismatch = false;

        // Missing levels are always considered a mismatch
        if (!levelIndexEntry[0].has_value() || !levelIndexEntry[1].has_value())
            mismatch = true;

        // Mismatching level data sizes are always considered a mismatch
        if (!mismatch && levelIndexEntry[0]->byteLength != levelIndexEntry[1]->byteLength)
            mismatch = true;

        if (!mismatch) {
            // If so far so good then load the level data and compare them
            std::unique_ptr<uint8_t[]> buffers[] = {
                std::make_unique<uint8_t[]>(levelIndexEntry[0]->byteLength),
                std::make_unique<uint8_t[]>(levelIndexEntry[1]->byteLength)
            };

            for (std::size_t i = 0; i < streams.size(); ++i)
                read(streams[i], levelIndexEntry[i]->byteOffset, buffers[i].get(),
                    levelIndexEntry[i]->byteLength, fmt::format("level {} data", level));

            if (std::memcmp(buffers[0].get(), buffers[1].get(), levelIndexEntry[0]->byteLength) != 0)
                mismatch = true;
        }

        if (mismatch)
            diff << DiffMismatch(fmt::format("Mismatch in level {} data", level), fmt::format("m={}", level));
    }
}